

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm.c
# Opt level: O0

void emit_vmdef(BuildCtx *ctx)

{
  FILE *__stream;
  char *pcVar1;
  char *p;
  char local_68 [4];
  int i;
  char buf [80];
  BuildCtx *ctx_local;
  
  fprintf((FILE *)ctx->fp,"-- This is a generated file. DO NOT EDIT!\n\n");
  fprintf((FILE *)ctx->fp,
          "assert(require(\"jit\").version == \"%s\", \"LuaJIT core/library version mismatch\")\n\n"
          ,"LuaJIT 2.1.1741897244");
  fprintf((FILE *)ctx->fp,"return {\n\n");
  fprintf((FILE *)ctx->fp,"bcnames = \"");
  for (p._4_4_ = 0; bc_names[p._4_4_] != (char *)0x0; p._4_4_ = p._4_4_ + 1) {
    fprintf((FILE *)ctx->fp,"%-6s",bc_names[p._4_4_]);
  }
  fprintf((FILE *)ctx->fp,"\",\n\n");
  fprintf((FILE *)ctx->fp,"irnames = \"");
  for (p._4_4_ = 0; ir_names[p._4_4_] != (char *)0x0; p._4_4_ = p._4_4_ + 1) {
    fprintf((FILE *)ctx->fp,"%-6s",ir_names[p._4_4_]);
  }
  fprintf((FILE *)ctx->fp,"\",\n\n");
  fprintf((FILE *)ctx->fp,"irfpm = { [0]=");
  for (p._4_4_ = 0; irfpm_names[p._4_4_] != (char *)0x0; p._4_4_ = p._4_4_ + 1) {
    __stream = (FILE *)ctx->fp;
    pcVar1 = lower(local_68,irfpm_names[p._4_4_]);
    fprintf(__stream,"\"%s\", ",pcVar1);
  }
  fprintf((FILE *)ctx->fp,"},\n\n");
  fprintf((FILE *)ctx->fp,"irfield = { [0]=");
  for (p._4_4_ = 0; irfield_names[p._4_4_] != (char *)0x0; p._4_4_ = p._4_4_ + 1) {
    lower(local_68,irfield_names[p._4_4_]);
    pcVar1 = strchr(local_68,0x5f);
    if (pcVar1 != (char *)0x0) {
      *pcVar1 = '.';
    }
    fprintf((FILE *)ctx->fp,"\"%s\", ",local_68);
  }
  fprintf((FILE *)ctx->fp,"},\n\n");
  fprintf((FILE *)ctx->fp,"ircall = {\n[0]=");
  for (p._4_4_ = 0; ircall_names[p._4_4_] != (char *)0x0; p._4_4_ = p._4_4_ + 1) {
    fprintf((FILE *)ctx->fp,"\"%s\",\n",ircall_names[p._4_4_]);
  }
  fprintf((FILE *)ctx->fp,"},\n\n");
  fprintf((FILE *)ctx->fp,"traceerr = {\n[0]=");
  for (p._4_4_ = 0; trace_errors[p._4_4_] != (char *)0x0; p._4_4_ = p._4_4_ + 1) {
    fprintf((FILE *)ctx->fp,"\"%s\",\n",trace_errors[p._4_4_]);
  }
  fprintf((FILE *)ctx->fp,"},\n\n");
  return;
}

Assistant:

static void emit_vmdef(BuildCtx *ctx)
{
#if LJ_HASJIT
  char buf[80];
#endif
  int i;
  fprintf(ctx->fp, "-- This is a generated file. DO NOT EDIT!\n\n");
  fprintf(ctx->fp, "assert(require(\"jit\").version == \"%s\", \"LuaJIT core/library version mismatch\")\n\n", LUAJIT_VERSION);
  fprintf(ctx->fp, "return {\n\n");

  fprintf(ctx->fp, "bcnames = \"");
  for (i = 0; bc_names[i]; i++) fprintf(ctx->fp, "%-6s", bc_names[i]);
  fprintf(ctx->fp, "\",\n\n");

#if LJ_HASJIT
  fprintf(ctx->fp, "irnames = \"");
  for (i = 0; ir_names[i]; i++) fprintf(ctx->fp, "%-6s", ir_names[i]);
  fprintf(ctx->fp, "\",\n\n");

  fprintf(ctx->fp, "irfpm = { [0]=");
  for (i = 0; irfpm_names[i]; i++)
    fprintf(ctx->fp, "\"%s\", ", lower(buf, irfpm_names[i]));
  fprintf(ctx->fp, "},\n\n");

  fprintf(ctx->fp, "irfield = { [0]=");
  for (i = 0; irfield_names[i]; i++) {
    char *p;
    lower(buf, irfield_names[i]);
    p = strchr(buf, '_');
    if (p) *p = '.';
    fprintf(ctx->fp, "\"%s\", ", buf);
  }
  fprintf(ctx->fp, "},\n\n");

  fprintf(ctx->fp, "ircall = {\n[0]=");
  for (i = 0; ircall_names[i]; i++)
    fprintf(ctx->fp, "\"%s\",\n", ircall_names[i]);
  fprintf(ctx->fp, "},\n\n");

  fprintf(ctx->fp, "traceerr = {\n[0]=");
  for (i = 0; trace_errors[i]; i++)
    fprintf(ctx->fp, "\"%s\",\n", trace_errors[i]);
  fprintf(ctx->fp, "},\n\n");
#endif
}